

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

int Gia_ManFindFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p,int nOutputs)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  char *__assertion;
  int v;
  int iVar7;
  
  if (pAig->vCis->nSize - pAig->nRegs == p->nPis) {
    Gia_ManCleanMark0(pAig);
    iVar7 = p->nRegs;
    for (iVar3 = 0; iVar3 <= p->iFrame; iVar3 = iVar3 + 1) {
      v = 0;
      while ((iVar1 = v + iVar7, v < pAig->vCis->nSize - pAig->nRegs &&
             (pGVar4 = Gia_ManCi(pAig,v), pGVar4 != (Gia_Obj_t *)0x0))) {
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)(((uint)(&p[1].iPo)[iVar1 >> 5] >> ((byte)iVar1 & 0x1f) & 1) << 0x1e);
        v = v + 1;
      }
      iVar7 = 0;
      while ((iVar7 < pAig->nObjs && (pGVar4 = Gia_ManObj(pAig,iVar7), pGVar4 != (Gia_Obj_t *)0x0)))
      {
        uVar2 = *(ulong *)pGVar4;
        if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
          uVar6 = (uint)(uVar2 >> 0x20);
          *(ulong *)pGVar4 =
               uVar2 & 0xffffffff3fffffff |
               (ulong)(((uVar6 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar6 & 0x1fffffff)) >> 0x1e) &
                        ((uint)(uVar2 >> 0x1d) & 7 ^
                        *(uint *)(pGVar4 + -(uVar2 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
        }
        iVar7 = iVar7 + 1;
      }
      iVar7 = 0;
      while ((iVar7 < pAig->vCos->nSize &&
             (pGVar4 = Gia_ManCo(pAig,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
        uVar6 = (uint)*(ulong *)pGVar4;
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)((uVar6 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
        iVar7 = iVar7 + 1;
      }
      iVar7 = 0;
      while (((iVar7 < pAig->nRegs &&
              (pGVar4 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7),
              pGVar4 != (Gia_Obj_t *)0x0)) &&
             (pGVar5 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7),
             pGVar5 != (Gia_Obj_t *)0x0))) {
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)pGVar4 & 0x40000000);
        iVar7 = iVar7 + 1;
      }
      iVar7 = iVar1;
    }
    if (iVar7 == p->nBits) {
      while ((iVar7 = -1, nOutputs < pAig->vCos->nSize - pAig->nRegs &&
             (pGVar4 = Gia_ManPo(pAig,nOutputs), iVar7 = nOutputs, (pGVar4->field_0x3 & 0x40) == 0))
            ) {
        nOutputs = nOutputs + 1;
      }
      Gia_ManCleanMark0(pAig);
      return iVar7;
    }
    __assertion = "iBit == p->nBits";
    uVar6 = 0x6c;
  }
  else {
    __assertion = "Gia_ManPiNum(pAig) == p->nPis";
    uVar6 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                ,uVar6,"int Gia_ManFindFailedPoCex(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

int Gia_ManFindFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p, int nOutputs )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
//    Gia_ManForEachRo( pAig, pObj, i )
//       pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
//	for ( i = Gia_ManPoNum(pAig) - 1; i >= nOutputs; i-- )
	for ( i = nOutputs; i < Gia_ManPoNum(pAig); i++ )
	{
        if ( Gia_ManPo(pAig, i)->fMark0 )
        {
            RetValue = i;
            break;
        }
	}
    Gia_ManCleanMark0(pAig);
    return RetValue;
}